

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O1

string * __thiscall
ExtendedMatrix::ToString_abi_cxx11_(string *__return_storage_ptr__,ExtendedMatrix *this)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  long *plVar7;
  Fraction *f;
  int column;
  ostringstream out;
  char local_1b1;
  string *local_1b0;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar2 = Matrix::GetNumRows(&this->main_);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar2);
  local_1b1 = ' ';
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_1b1,1);
  iVar2 = Matrix::GetNumColumns(&this->main_);
  iVar3 = Matrix::GetNumColumns(&this->extension_);
  plVar7 = (long *)std::ostream::operator<<((ostream *)poVar6,iVar3 + iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  iVar2 = 0;
  local_1b0 = __return_storage_ptr__;
  while( true ) {
    iVar3 = Matrix::GetNumRows(&this->main_);
    psVar1 = local_1b0;
    if (iVar3 <= iVar2) break;
    iVar3 = 0;
    while( true ) {
      iVar4 = Matrix::GetNumColumns(&this->main_);
      iVar5 = Matrix::GetNumColumns(&this->extension_);
      if (iVar5 + iVar4 <= iVar3) break;
      f = At(this,iVar2,iVar3);
      poVar6 = operator<<((ostream *)local_1a8,f);
      local_1b1 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_1b1,1);
      iVar3 = iVar3 + 1;
    }
    iVar3 = Matrix::GetNumRows(&this->main_);
    iVar2 = iVar2 + 1;
    if (iVar2 != iVar3) {
      std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
      std::ostream::put((char)local_1a8);
      std::ostream::flush();
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

std::string ExtendedMatrix::ToString() const {
  std::ostringstream out;
  out << GetNumRows() << ' ' << GetNumColumns() << std::endl;
  for (int row = 0; row < GetNumRows(); ++row) {
    for (int column = 0; column < GetNumColumns(); ++column) {
      out << At(row, column) << ' ';
    }
    if (row + 1 != GetNumRows()) {
      out << std::endl;
    }
  }

  return out.str();
}